

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O3

void swrenderer::R_ProjectParticle
               (particle_t *particle,sector_t_conflict *sector,int shade,int fakeside)

{
  double *pdVar1;
  double dVar2;
  line_t *line;
  BYTE *pBVar3;
  uint uVar4;
  int iVar5;
  sector_t_conflict *psVar6;
  vissprite_t *pvVar7;
  int iVar8;
  secplane_t *psVar9;
  FTextureID *pFVar10;
  int iVar11;
  FTextureID *pFVar12;
  BYTE *pBVar13;
  secplane_t *psVar14;
  int iVar15;
  int iVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  dVar19 = (particle->Pos).X;
  uVar17 = SUB84(dVar19,0);
  uVar18 = (undefined4)((ulong)dVar19 >> 0x20);
  if (CurrentPortal != 0) {
    dVar2 = (particle->Pos).Y;
    line = *(line_t **)(CurrentPortal + 8);
    if (((byte)i_compatflags2 & 8) == 0) {
      uVar4 = (uint)(1.52587890625e-05 <
                    (line->delta).Y * ((line->v1->p).X - dVar19) +
                    (line->delta).X * (dVar2 - (line->v1->p).Y));
    }
    else {
      uVar4 = P_VanillaPointOnLineSide(dVar19,dVar2,line);
    }
    if (uVar4 != 0) {
      return;
    }
    dVar19 = (particle->Pos).X;
    uVar17 = SUB84(dVar19,0);
    uVar18 = (undefined4)((ulong)dVar19 >> 0x20);
  }
  dVar19 = (double)CONCAT44(uVar18,uVar17) - ViewPos.X;
  dVar2 = (particle->Pos).Y - ViewPos.Y;
  dVar21 = ViewTanSin * dVar2 + ViewTanCos * dVar19;
  if (0.0078125 <= dVar21) {
    dVar19 = ViewSin * dVar19 - ViewCos * dVar2;
    if ((MirrorFlags & 1) != 0) {
      dVar19 = (-1.0 - dVar19) + (double)viewwidth;
    }
    if (ABS(dVar19) < dVar21) {
      dVar20 = 1.0 / dVar21;
      dVar2 = particle->size * 0.125;
      dVar22 = (double)centerx * dVar20;
      iVar16 = SUB84((dVar19 - dVar2) * dVar22 + 6755399441055744.0,0) + centerx;
      if (iVar16 < WindowLeft) {
        iVar16 = WindowLeft;
      }
      iVar15 = SUB84((dVar2 + dVar19) * dVar22 + 6755399441055744.0,0) + centerx;
      if (WindowRight < iVar15) {
        iVar15 = WindowRight;
      }
      if (iVar16 < iVar15) {
        dVar19 = (particle->Pos).Z - ViewPos.Z;
        iVar5 = SUB84((CenterY + 6755399441055744.0) - (dVar19 + dVar2) * YaspectMul * dVar22,0);
        iVar11 = (int)(short)(&ceilingclip)[iVar16];
        if ((short)(&ceilingclip)[iVar16] < iVar5) {
          iVar11 = iVar5;
        }
        if (iVar11 <= *(short *)(&DAT_0178728e + (long)iVar15 * 2)) {
          iVar11 = (int)*(short *)(&DAT_0178728e + (long)iVar15 * 2);
        }
        iVar8 = SUB84((dVar2 - dVar19) * YaspectMul * dVar22 + CenterY + 6755399441055744.0,0);
        iVar5 = (short)(&floorclip)[iVar16] + -1;
        if (iVar8 < (short)(&floorclip)[iVar16]) {
          iVar5 = iVar8;
        }
        iVar8 = *(short *)(&DAT_0178458e + (long)iVar15 * 2) + -1;
        if (iVar5 < *(short *)(&DAT_0178458e + (long)iVar15 * 2)) {
          iVar8 = iVar5;
        }
        if (iVar11 <= iVar8) {
          psVar6 = sector_t::GetHeightSec(sector);
          if (psVar6 == (sector_t_conflict *)0x0) {
            psVar14 = &sector->ceilingplane;
            psVar9 = &sector->floorplane;
            pFVar10 = &sector->planes[1].Texture;
            pFVar12 = &sector->planes[0].Texture;
          }
          else if (fakeside == 1) {
            psVar14 = &psVar6->floorplane;
            psVar9 = &sector->floorplane;
            pFVar10 = &psVar6->planes[0].Texture;
            pFVar12 = &sector->planes[0].Texture;
            sector = psVar6;
          }
          else if (fakeside == 2) {
            psVar14 = &sector->ceilingplane;
            psVar9 = &psVar6->ceilingplane;
            pFVar10 = &sector->planes[1].Texture;
            pFVar12 = &psVar6->planes[1].Texture;
            sector = psVar6;
          }
          else {
            psVar14 = &psVar6->ceilingplane;
            psVar9 = &psVar6->floorplane;
            pFVar10 = &psVar6->planes[1].Texture;
            pFVar12 = &psVar6->planes[0].Texture;
          }
          pBVar3 = sector->ColorMap->Maps;
          if (((pFVar12->texnum == skyflatnum.texnum) ||
              (dVar19 = ((psVar9->normal).Y * (particle->Pos).Y +
                        psVar9->D + (psVar9->normal).X * (particle->Pos).X) * psVar9->negiC,
              pdVar1 = &(particle->Pos).Z, dVar19 < *pdVar1 || dVar19 == *pdVar1)) &&
             ((pFVar10->texnum == skyflatnum.texnum ||
              (dVar19 = ((psVar14->normal).Y * (particle->Pos).Y +
                        psVar14->D + (psVar14->normal).X * (particle->Pos).X) * psVar14->negiC,
              pdVar1 = &(particle->Pos).Z, *pdVar1 <= dVar19 && dVar19 != *pdVar1)))) {
            pvVar7 = R_NewVisSprite();
            pvVar7->CurrentPortalUniq = CurrentPortalUniq;
            pvVar7->heightsec = psVar6;
            pvVar7->xscale = SUB84(dVar22 + 103079215104.0,0);
            pvVar7->yscale = (float)dVar22;
            pvVar7->depth = (float)dVar21;
            pvVar7->idepth = (float)dVar20;
            (pvVar7->gpos).Z = (float)(particle->Pos).Z;
            dVar19 = (particle->Pos).Y;
            (pvVar7->gpos).X = (float)(particle->Pos).X;
            (pvVar7->gpos).Y = (float)dVar19;
            (pvVar7->field_3).field_1.y1 = iVar11;
            (pvVar7->field_3).field_1.y2 = iVar8;
            pvVar7->x1 = (short)iVar16;
            pvVar7->x2 = (short)iVar15;
            pvVar7->Translation = 0;
            *(uint *)((long)&pvVar7->field_14 + 8) = (uint)*(byte *)((long)&particle->color + 3);
            (pvVar7->field_13).pic = (FTexture *)0x0;
            pvVar7->field_0x90 = pvVar7->field_0x90 & 0xfe;
            pvVar7->renderflags = (ushort)particle->trans;
            pvVar7->FakeFlatStat = (BYTE)fakeside;
            pvVar7->floorclip = 0.0;
            pvVar7->ColormapNum = '\0';
            if ((long)fixedlightlev < 0) {
              pBVar13 = fixedcolormap;
              if (fixedcolormap == (BYTE *)0x0) {
                if (particle->bright == '\0') {
                  dVar19 = dVar20 * 0.5 * r_SpriteVisibility;
                  if (24.0 <= dVar19) {
                    dVar19 = 24.0;
                  }
                  iVar15 = shade - SUB84(dVar19 + 103079215104.0,0) >> 0x10;
                  iVar16 = 0x1f;
                  if (iVar15 < 0x1f) {
                    iVar16 = iVar15;
                  }
                  iVar15 = 0;
                  if (0 < iVar16) {
                    iVar15 = iVar16;
                  }
                  pvVar7->ColormapNum = (BYTE)iVar15;
                  pBVar13 = pBVar3 + (uint)(iVar15 << 8);
                }
                else {
                  pBVar13 = pBVar3;
                  if (r_fullbrightignoresectorcolor.Value != false) {
                    pBVar13 = FullNormalLight.Maps;
                  }
                }
              }
            }
            else {
              pBVar13 = pBVar3 + fixedlightlev;
            }
            (pvVar7->Style).colormap = pBVar13;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void R_ProjectParticle (particle_t *particle, const sector_t *sector, int shade, int fakeside)
{
	double 				tr_x, tr_y;
	double 				tx, ty;
	double	 			tz, tiz;
	double	 			xscale, yscale;
	int 				x1, x2, y1, y2;
	vissprite_t*		vis;
	sector_t*			heightsec = NULL;
	BYTE*				map;

	// [ZZ] Particle not visible through the portal plane
	if (CurrentPortal && !!P_PointOnLineSide(particle->Pos, CurrentPortal->dst))
		return;

	// transform the origin point
	tr_x = particle->Pos.X - ViewPos.X;
	tr_y = particle->Pos.Y - ViewPos.Y;

	tz = tr_x * ViewTanCos + tr_y * ViewTanSin;

	// particle is behind view plane?
	if (tz < MINZ)
		return;

	tx = tr_x * ViewSin - tr_y * ViewCos;

	// Flip for mirrors
	if (MirrorFlags & RF_XFLIP)
	{
		tx = viewwidth - tx - 1;
	}

	// too far off the side?
	if (tz <= fabs(tx))
		return;

	tiz = 1 / tz;
	xscale = centerx * tiz;

	// calculate edges of the shape
	double psize = particle->size / 8.0;

	x1 = MAX<int>(WindowLeft, centerx + xs_RoundToInt((tx - psize) * xscale));
	x2 = MIN<int>(WindowRight, centerx + xs_RoundToInt((tx + psize) * xscale));

	if (x1 >= x2)
		return;

	yscale = YaspectMul * xscale;
	ty = particle->Pos.Z - ViewPos.Z;
	y1 = xs_RoundToInt(CenterY - (ty + psize) * yscale);
	y2 = xs_RoundToInt(CenterY - (ty - psize) * yscale);

	// Clip the particle now. Because it's a point and projected as its subsector is
	// entered, we don't need to clip it to drawsegs like a normal sprite.

	// Clip particles behind walls.
	if (y1 <  ceilingclip[x1])		y1 = ceilingclip[x1];
	if (y1 <  ceilingclip[x2-1])	y1 = ceilingclip[x2-1];
	if (y2 >= floorclip[x1])		y2 = floorclip[x1] - 1;
	if (y2 >= floorclip[x2-1])		y2 = floorclip[x2-1] - 1;

	if (y1 > y2)
		return;

	// Clip particles above the ceiling or below the floor.
	heightsec = sector->GetHeightSec();

	const secplane_t *topplane;
	const secplane_t *botplane;
	FTextureID toppic;
	FTextureID botpic;

	if (heightsec)	// only clip things which are in special sectors
	{
		if (fakeside == FAKED_AboveCeiling)
		{
			topplane = &sector->ceilingplane;
			botplane = &heightsec->ceilingplane;
			toppic = sector->GetTexture(sector_t::ceiling);
			botpic = heightsec->GetTexture(sector_t::ceiling);
			map = heightsec->ColorMap->Maps;
		}
		else if (fakeside == FAKED_BelowFloor)
		{
			topplane = &heightsec->floorplane;
			botplane = &sector->floorplane;
			toppic = heightsec->GetTexture(sector_t::floor);
			botpic = sector->GetTexture(sector_t::floor);
			map = heightsec->ColorMap->Maps;
		}
		else
		{
			topplane = &heightsec->ceilingplane;
			botplane = &heightsec->floorplane;
			toppic = heightsec->GetTexture(sector_t::ceiling);
			botpic = heightsec->GetTexture(sector_t::floor);
			map = sector->ColorMap->Maps;
		}
	}
	else
	{
		topplane = &sector->ceilingplane;
		botplane = &sector->floorplane;
		toppic = sector->GetTexture(sector_t::ceiling);
		botpic = sector->GetTexture(sector_t::floor);
		map = sector->ColorMap->Maps;
	}

	if (botpic != skyflatnum && particle->Pos.Z < botplane->ZatPoint (particle->Pos))
		return;
	if (toppic != skyflatnum && particle->Pos.Z >= topplane->ZatPoint (particle->Pos))
		return;

	// store information in a vissprite
	vis = R_NewVisSprite ();
	vis->CurrentPortalUniq = CurrentPortalUniq;
	vis->heightsec = heightsec;
	vis->xscale = FLOAT2FIXED(xscale);
	vis->yscale = (float)xscale;
//	vis->yscale *= InvZtoScale;
	vis->depth = (float)tz;
	vis->idepth = float(1 / tz);
	vis->gpos = { (float)particle->Pos.X, (float)particle->Pos.Y, (float)particle->Pos.Z };
	vis->y1 = y1;
	vis->y2 = y2;
	vis->x1 = x1;
	vis->x2 = x2;
	vis->Translation = 0;
	vis->startfrac = 255 & (particle->color >>24);
	vis->pic = NULL;
	vis->bIsVoxel = false;
	vis->renderflags = particle->trans;
	vis->FakeFlatStat = fakeside;
	vis->floorclip = 0;
	vis->ColormapNum = 0;

	if (fixedlightlev >= 0)
	{
		vis->Style.colormap = map + fixedlightlev;
	}
	else if (fixedcolormap)
	{
		vis->Style.colormap = fixedcolormap;
	}
	else if (particle->bright)
	{
		vis->Style.colormap = (r_fullbrightignoresectorcolor) ? FullNormalLight.Maps : map;
	}
	else
	{
		// Particles are slightly more visible than regular sprites.
		vis->ColormapNum = GETPALOOKUP(tiz * r_SpriteVisibility * 0.5, shade);
		vis->Style.colormap = map + (vis->ColormapNum << COLORMAPSHIFT);
	}
}